

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm_pbio.c
# Opt level: O0

int CMpbio_send_format_request(char *format_ID,int format_ID_length,CMConnection conn,int cond)

{
  FILE *__stream;
  int iVar1;
  __pid_t _Var2;
  pthread_t pVar3;
  long *in_RDX;
  int in_ESI;
  undefined8 in_RDI;
  timespec ts;
  int actual;
  FFSEncodeVec vec [2];
  pbio_exchange_msg msg;
  CMConnection in_stack_ffffffffffffff80;
  long local_78;
  undefined4 *local_68;
  undefined8 local_60;
  undefined4 local_3c;
  int local_38;
  undefined4 local_34;
  undefined4 local_28;
  long *local_20;
  int local_14;
  uint local_4;
  
  local_3c = 0x5042494f;
  local_38 = in_ESI + 0x10;
  local_34 = 0;
  local_28 = 0;
  local_68 = &local_3c;
  local_60 = 0x18;
  local_20 = in_RDX;
  local_14 = in_ESI;
  if (*(long *)(*in_RDX + 0x120) == 0) {
    iVar1 = CMtrace_init((CManager)(long)in_ESI,(CMTraceType)((ulong)in_RDI >> 0x20));
    if (iVar1 == 0) goto LAB_00133ceb;
  }
  else if (CMtrace_val[3] == 0) goto LAB_00133ceb;
  if (CMtrace_PID != 0) {
    __stream = *(FILE **)(*local_20 + 0x120);
    _Var2 = getpid();
    pVar3 = pthread_self();
    fprintf(__stream,"P%lxT%lx - ",(long)_Var2,pVar3);
  }
  if (CMtrace_timing != 0) {
    clock_gettime(1,(timespec *)&stack0xffffffffffffff80);
    fprintf(*(FILE **)(*local_20 + 0x120),"%lld.%.9ld - ",in_stack_ffffffffffffff80,local_78);
  }
  fprintf(*(FILE **)(*local_20 + 0x120),"CMpbio send format request - total %d bytes in writev\n",
          (ulong)(local_14 + 0x18));
LAB_00133ceb:
  fflush(*(FILE **)(*local_20 + 0x120));
  iVar1 = (**(code **)(local_20[1] + 0x78))(&CMstatic_trans_svcs,local_20[2],&local_68,2,0);
  if (iVar1 != 2) {
    internal_connection_close(in_stack_ffffffffffffff80);
  }
  local_4 = (uint)(iVar1 == 2);
  return local_4;
}

Assistant:

static int
CMpbio_send_format_request(char *format_ID, int format_ID_length,
			   CMConnection conn, int cond)
{
    struct pbio_exchange_msg msg;
    struct FFSEncodeVec vec[2];
    int actual;

    msg.magic = MAGIC;
    msg.msg_len = sizeof(msg) - 8 + format_ID_length;
    msg.msg_type = PBIO_QUERY;
    msg.payload1_length = format_ID_length;
    msg.payload2_length = 0;
    msg.cond = cond;
    vec[0].iov_base = &msg;
    vec[0].iov_len = sizeof(msg);
    vec[1].iov_base = format_ID;
    vec[1].iov_len = format_ID_length;
    CMtrace_out(conn->cm, CMLowLevelVerbose, "CMpbio send format request - total %d bytes in writev\n", (int)(format_ID_length + sizeof(msg)));
    actual = conn->trans->writev_func(&CMstatic_trans_svcs, 
				      conn->transport_data, 
				      &vec[0], 2, NULL);
    if (actual != 2) {
	internal_connection_close(conn);
	return 0;
    }
    return 1;
}